

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVector<slang::syntax::RsCaseItemSyntax_*,_5UL>::SmallVector
          (SmallVector<slang::syntax::RsCaseItemSyntax_*,_5UL> *this,size_type capacity)

{
  (this->super_SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>).firstElement;
  (this->super_SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>).len = 0;
  (this->super_SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>).cap = 5;
  SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>::reserve
            (&this->super_SmallVectorBase<slang::syntax::RsCaseItemSyntax_*>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }